

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int renameTableSelectCb(Walker *pWalker,Select *pSelect)

{
  RenameCtx *pCtx;
  SrcList *pSVar1;
  Select *in_RSI;
  Walker *in_RDI;
  SrcItem *pItem;
  SrcList *pSrc;
  RenameCtx *p;
  int i;
  int local_1c;
  int local_4;
  
  pCtx = (in_RDI->u).pRename;
  pSVar1 = in_RSI->pSrc;
  if ((in_RSI->selFlags & 0x4200000) == 0) {
    if (pSVar1 == (SrcList *)0x0) {
      local_4 = 2;
    }
    else {
      for (local_1c = 0; local_1c < pSVar1->nSrc; local_1c = local_1c + 1) {
        if (pSVar1->a[local_1c].pSTab == pCtx->pTab) {
          renameTokenFind(in_RDI->pParse,pCtx,pSVar1->a[local_1c].zName);
        }
      }
      renameWalkWith(in_RDI,in_RSI);
      local_4 = 0;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int renameTableSelectCb(Walker *pWalker, Select *pSelect){
  int i;
  RenameCtx *p = pWalker->u.pRename;
  SrcList *pSrc = pSelect->pSrc;
  if( pSelect->selFlags & (SF_View|SF_CopyCte) ){
    testcase( pSelect->selFlags & SF_View );
    testcase( pSelect->selFlags & SF_CopyCte );
    return WRC_Prune;
  }
  if( NEVER(pSrc==0) ){
    assert( pWalker->pParse->db->mallocFailed );
    return WRC_Abort;
  }
  for(i=0; i<pSrc->nSrc; i++){
    SrcItem *pItem = &pSrc->a[i];
    if( pItem->pSTab==p->pTab ){
      renameTokenFind(pWalker->pParse, p, pItem->zName);
    }
  }
  renameWalkWith(pWalker, pSelect);

  return WRC_Continue;
}